

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::VertexInput::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  VkExtent3D *extent;
  undefined1 (*pauVar1) [12];
  DeviceInterface *vk;
  VkDevice device;
  _func_int *bufferSize;
  Allocation *pAVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> data;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> data_00;
  VkImageSubresourceRange subresourceRange;
  Location *pLVar4;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *pUVar5;
  OperationContext *pOVar6;
  deUint32 stride;
  Operation *pOVar7;
  Buffer *this_00;
  DescriptorSetLayoutBuilder *this_01;
  DescriptorPoolBuilder *this_02;
  DescriptorSetUpdateBuilder *this_03;
  Image *this_04;
  TextureFormat format;
  GraphicsPipelineBuilder *pGVar8;
  ProgramBinary *pPVar9;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_258;
  allocator<char> local_232;
  allocator<char> local_231;
  Location *local_230;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_228;
  Location *local_208;
  Location *local_200;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *local_1f8;
  Location *local_1f0;
  Location *local_1e8;
  Location *local_1e0;
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
  *local_1d8;
  Location *local_1d0;
  Location *local_1c8;
  Allocator *local_1c0;
  MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  *local_1b8;
  OperationContext *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  deUint32 local_198;
  VkDescriptorBufferInfo outputBufferDescriptorInfo;
  GraphicsPipelineBuilder local_178;
  string local_70;
  string local_50;
  
  local_1b8 = __return_storage_ptr__;
  pOVar7 = (Operation *)operator_new(0x180);
  pOVar7->_vptr_Operation = (_func_int **)&PTR__Implementation_00bdd850;
  pOVar7[1]._vptr_Operation = (_func_int **)context;
  pOVar7[2]._vptr_Operation = (_func_int **)resource;
  pOVar7[3]._vptr_Operation = (_func_int **)0x0;
  local_1f8 = (UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
               *)(pOVar7 + 3);
  pOVar7[5]._vptr_Operation = (_func_int **)0x0;
  pOVar7[7]._vptr_Operation = (_func_int **)0x0;
  local_200 = (Location *)(pOVar7 + 9);
  local_1e8 = (Location *)(pOVar7 + 0xd);
  local_208 = (Location *)(pOVar7 + 0x11);
  local_1f0 = (Location *)(pOVar7 + 0x15);
  local_1d8 = (UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
               *)(pOVar7 + 0x1a);
  pOVar7[0x1a]._vptr_Operation = (_func_int **)0x0;
  local_1e0 = (Location *)(pOVar7 + 0x1c);
  pOVar7[0x1c]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x1d]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x1e]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x1f]._vptr_Operation = (_func_int **)0x0;
  local_1c8 = (Location *)(pOVar7 + 0x24);
  local_230 = (Location *)(pOVar7 + 0x28);
  local_1d0 = (Location *)(pOVar7 + 0x2c);
  pOVar7[9]._vptr_Operation = (_func_int **)0x0;
  pOVar7[10]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0xb]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0xc]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0xd]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0xe]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0xf]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x10]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x11]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x12]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x13]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x14]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x15]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x16]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x17]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x18]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x24]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x25]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x26]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x27]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x28]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x29]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x2a]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x2b]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x2c]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x2d]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x2e]._vptr_Operation = (_func_int **)0x0;
  pOVar7[0x2f]._vptr_Operation = (_func_int **)0x0;
  requireFeaturesForSSBOAccess(context,1);
  vk = context->m_vk;
  device = context->m_device;
  local_1c0 = context->m_allocator;
  bufferSize = pOVar7[2]._vptr_Operation[5];
  this_00 = (Buffer *)operator_new(0x30);
  local_1b0 = context;
  makeBufferCreateInfo((VkBufferCreateInfo *)&local_178,(VkDeviceSize)bufferSize,0x20);
  synchronization::Buffer::Buffer
            (this_00,vk,device,local_1c0,(VkBufferCreateInfo *)&local_178,(MemoryRequirement)0x1);
  pUVar5 = local_1f8;
  local_258.m_data.object.m_internal._0_4_ = 0;
  local_258.m_data.object.m_internal._4_4_ = 0;
  data.ptr._4_4_ = in_stack_fffffffffffffd8c;
  data.ptr._0_4_ = in_stack_fffffffffffffd88;
  data._8_4_ = in_stack_fffffffffffffd90;
  data._12_4_ = in_stack_fffffffffffffd94;
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
  assignData(local_1f8,data);
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
  ~UniqueBase((UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
               *)&local_258);
  pAVar2 = (((pUVar5->m_data).ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memset(pAVar2->m_hostPtr,0,(size_t)bufferSize);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,
             (VkDeviceSize)bufferSize);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&local_178);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)&local_178,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1)
  ;
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_228,this_01,vk,device,0);
  pLVar4 = local_230;
  local_258.m_data.deleter.m_device = local_228.m_data.deleter.m_device;
  local_258.m_data.deleter.m_allocator = local_228.m_data.deleter.m_allocator;
  local_258.m_data.object.m_internal = local_228.m_data.object.m_internal;
  local_258.m_data.deleter.m_deviceIface = local_228.m_data.deleter.m_deviceIface;
  local_228.m_data.object.m_internal._0_4_ = 0;
  local_228.m_data.object.m_internal._4_4_ = 0;
  local_228.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_228.m_data.deleter.m_device = (VkDevice)0x0;
  local_228.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_230);
  pLVar4[2] = (Location)local_258.m_data.deleter.m_device;
  pLVar4[3] = (Location)local_258.m_data.deleter.m_allocator;
  pLVar4->m_binding = (undefined4)local_258.m_data.object.m_internal;
  pLVar4->m_arrayElement = local_258.m_data.object.m_internal._4_4_;
  pLVar4[1] = (Location)local_258.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_228);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&local_178);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_228);
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_228,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&local_258,this_02,vk,device,1,1);
  pLVar4 = local_1c8;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_258.m_data.deleter.m_device;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)local_258.m_data.deleter.m_allocator;
  local_178.m_renderSize.m_data[0] = (undefined4)local_258.m_data.object.m_internal;
  local_178.m_renderSize.m_data[1] = local_258.m_data.object.m_internal._4_4_;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)local_258.m_data.deleter.m_deviceIface;
  local_258.m_data.object.m_internal._0_4_ = 0;
  local_258.m_data.object.m_internal._4_4_ = 0;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_258.m_data.deleter.m_device = (VkDevice)0x0;
  local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_1c8);
  pLVar4[2] = (Location)
              local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_deviceIface;
  pLVar4[3] = (Location)
              local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_device;
  pLVar4->m_binding = local_178.m_renderSize.m_data[0];
  pLVar4->m_arrayElement = local_178.m_renderSize.m_data[1];
  pLVar4[1].m_binding =
       (undefined4)
       local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  pLVar4[1].m_arrayElement =
       local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_258);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&local_228);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_258,vk,device,
                    (VkDescriptorPool)*pLVar4,(VkDescriptorSetLayout)*local_230);
  pLVar4 = local_1d0;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_258.m_data.deleter.m_device;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)local_258.m_data.deleter.m_allocator;
  local_178.m_renderSize.m_data[0] = (undefined4)local_258.m_data.object.m_internal;
  local_178.m_renderSize.m_data[1] = local_258.m_data.object.m_internal._4_4_;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)local_258.m_data.deleter.m_deviceIface;
  local_258.m_data.object.m_internal._0_4_ = 0;
  local_258.m_data.object.m_internal._4_4_ = 0;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_258.m_data.deleter.m_device = (VkDevice)0x0;
  local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_1d0);
  pLVar4[2] = (Location)
              local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_deviceIface;
  pLVar4[3] = (Location)
              local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_device;
  pLVar4->m_binding = local_178.m_renderSize.m_data[0];
  pLVar4->m_arrayElement = local_178.m_renderSize.m_data[1];
  pLVar4[1].m_binding =
       (undefined4)
       local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  pLVar4[1].m_arrayElement =
       local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&local_258);
  outputBufferDescriptorInfo.buffer.m_internal =
       (((local_1f8->m_data).ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
       object.m_internal;
  outputBufferDescriptorInfo.offset = 0;
  outputBufferDescriptorInfo.range = (VkDeviceSize)bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_178);
  local_258.m_data.object.m_internal._0_4_ = 0;
  local_258.m_data.object.m_internal._4_4_ = 0;
  this_03 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&local_178,(VkDescriptorSet)*pLVar4,
                       (Location *)&local_258,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       &outputBufferDescriptorInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_03,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_178);
  *(undefined4 *)&pOVar7[0x19]._vptr_Operation = 0x25;
  *(undefined8 *)((long)&pOVar7[0x21]._vptr_Operation + 4) = 1;
  *(undefined8 *)((long)&pOVar7[0x22]._vptr_Operation + 4) = 1;
  *(undefined4 *)((long)&pOVar7[0x23]._vptr_Operation + 4) = 1;
  pOVar7[0x20]._vptr_Operation = (_func_int **)0x1000000010;
  *(undefined4 *)&pOVar7[0x21]._vptr_Operation = 1;
  this_04 = (Image *)operator_new(0x30);
  extent = (VkExtent3D *)(pOVar7 + 0x20);
  makeImageCreateInfo((VkImageCreateInfo *)&local_178,VK_IMAGE_TYPE_2D,extent,
                      VK_FORMAT_R8G8B8A8_UNORM,0x10);
  synchronization::Image::Image
            (this_04,vk,device,local_1c0,(VkImageCreateInfo *)&local_178,(MemoryRequirement)0x0);
  local_258.m_data.object.m_internal._0_4_ = 0;
  local_258.m_data.object.m_internal._4_4_ = 0;
  data_00.ptr._4_4_ = in_stack_fffffffffffffd8c;
  data_00.ptr._0_4_ = in_stack_fffffffffffffd88;
  data_00._8_4_ = in_stack_fffffffffffffd90;
  data_00._12_4_ = in_stack_fffffffffffffd94;
  de::details::
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::
  assignData(local_1d8,data_00);
  pauVar1 = (undefined1 (*) [12])((long)&pOVar7[0x21]._vptr_Operation + 4);
  de::details::
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::
  ~UniqueBase((UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
               *)&local_258);
  local_198 = *(deUint32 *)((long)&pOVar7[0x23]._vptr_Operation + 4);
  local_1a8 = *(undefined8 *)*pauVar1;
  uStack_1a0 = *(undefined8 *)((long)&pOVar7[0x22]._vptr_Operation + 4);
  subresourceRange.baseArrayLayer = (int)((ulong)uStack_1a0 >> 0x20);
  subresourceRange._0_12_ = *pauVar1;
  subresourceRange.layerCount = local_198;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_258,vk,device,
                (VkImage)*pOVar7[0x1a]._vptr_Operation,VK_IMAGE_VIEW_TYPE_2D,
                *(VkFormat *)&pOVar7[0x19]._vptr_Operation,subresourceRange);
  pLVar4 = local_1e0;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_258.m_data.deleter.m_device;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)local_258.m_data.deleter.m_allocator;
  local_178.m_renderSize.m_data[0] = (undefined4)local_258.m_data.object.m_internal;
  local_178.m_renderSize.m_data[1] = local_258.m_data.object.m_internal._4_4_;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)local_258.m_data.deleter.m_deviceIface;
  local_258.m_data.object.m_internal._0_4_ = 0;
  local_258.m_data.object.m_internal._4_4_ = 0;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_258.m_data.deleter.m_device = (VkDevice)0x0;
  local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_1e0);
  pLVar4[2] = (Location)
              local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_deviceIface;
  pLVar4[3] = (Location)
              local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_device;
  pLVar4->m_binding = local_178.m_renderSize.m_data[0];
  pLVar4->m_arrayElement = local_178.m_renderSize.m_data[1];
  pLVar4[1].m_binding =
       (undefined4)
       local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  pLVar4[1].m_arrayElement =
       local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&local_258);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&local_258,vk,device,
                 *(VkFormat *)&pOVar7[0x19]._vptr_Operation);
  pLVar4 = local_200;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_258.m_data.deleter.m_device;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)local_258.m_data.deleter.m_allocator;
  local_178.m_renderSize.m_data[0] = (undefined4)local_258.m_data.object.m_internal;
  local_178.m_renderSize.m_data[1] = local_258.m_data.object.m_internal._4_4_;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)local_258.m_data.deleter.m_deviceIface;
  local_258.m_data.object.m_internal._0_4_ = 0;
  local_258.m_data.object.m_internal._4_4_ = 0;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_258.m_data.deleter.m_device = (VkDevice)0x0;
  local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_200);
  pLVar4[2] = (Location)
              local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_deviceIface;
  pLVar4[3] = (Location)
              local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_device;
  pLVar4->m_binding = local_178.m_renderSize.m_data[0];
  pLVar4->m_arrayElement = local_178.m_renderSize.m_data[1];
  pLVar4[1].m_binding =
       (undefined4)
       local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  pLVar4[1].m_arrayElement =
       local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&local_258);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&local_258,vk,device,
                  (VkRenderPass)pOVar7[9]._vptr_Operation,(VkImageView)pOVar7[0x1c]._vptr_Operation,
                  *(deUint32 *)&pOVar7[0x20]._vptr_Operation,
                  *(deUint32 *)((long)&pOVar7[0x20]._vptr_Operation + 4),1);
  pLVar4 = local_1e8;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_258.m_data.deleter.m_device;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)local_258.m_data.deleter.m_allocator;
  local_178.m_renderSize.m_data[0] = (undefined4)local_258.m_data.object.m_internal;
  local_178.m_renderSize.m_data[1] = local_258.m_data.object.m_internal._4_4_;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)local_258.m_data.deleter.m_deviceIface;
  local_258.m_data.object.m_internal._0_4_ = 0;
  local_258.m_data.object.m_internal._4_4_ = 0;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_258.m_data.deleter.m_device = (VkDevice)0x0;
  local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_1e8);
  pLVar4[2] = (Location)
              local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_deviceIface;
  pLVar4[3] = (Location)
              local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_device;
  pLVar4->m_binding = local_178.m_renderSize.m_data[0];
  pLVar4->m_arrayElement = local_178.m_renderSize.m_data[1];
  pLVar4[1].m_binding =
       (undefined4)
       local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  pLVar4[1].m_arrayElement =
       local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&local_258);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&local_258,vk,device,
                     (VkDescriptorSetLayout)*local_230);
  pLVar4 = local_208;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_258.m_data.deleter.m_device;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)local_258.m_data.deleter.m_allocator;
  local_178.m_renderSize.m_data[0] = (undefined4)local_258.m_data.object.m_internal;
  local_178.m_renderSize.m_data[1] = local_258.m_data.object.m_internal._4_4_;
  local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)local_258.m_data.deleter.m_deviceIface;
  local_258.m_data.object.m_internal._0_4_ = 0;
  local_258.m_data.object.m_internal._4_4_ = 0;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_258.m_data.deleter.m_device = (VkDevice)0x0;
  local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_208);
  pLVar4[2] = (Location)
              local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_deviceIface;
  pLVar4[3] = (Location)
              local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_device;
  pLVar4->m_binding = local_178.m_renderSize.m_data[0];
  pLVar4->m_arrayElement = local_178.m_renderSize.m_data[1];
  pLVar4[1].m_binding =
       (undefined4)
       local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  pLVar4[1].m_arrayElement =
       local_178.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_258);
  memset(&local_178.m_vertexShaderModule,0,0xf4);
  local_178.m_patchControlPoints = 1;
  local_178.m_blendEnable = false;
  local_178.m_primitiveTopology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_178.m_renderSize.m_data[0] = extent->width;
  local_178.m_renderSize.m_data[1] = extent->height;
  format = ::vk::mapVkFormat(VK_FORMAT_R32G32B32A32_UINT);
  stride = tcu::getPixelSize(format);
  pGVar8 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                     (&local_178,VK_FORMAT_R32G32B32A32_UINT,stride);
  pOVar6 = local_1b0;
  pPVar3 = local_1b0->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"input_vert",&local_231);
  pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&local_50);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_VERTEX_BIT,pPVar9,(VkSpecializationInfo *)0x0
                     );
  pPVar3 = pOVar6->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"input_frag",&local_232);
  pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&local_70);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar9,
                      (VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_228,pGVar8,vk,device,
             (VkPipelineLayout)*local_208,(VkRenderPass)*local_200,pOVar6->m_pipelineCacheData);
  pLVar4 = local_1f0;
  local_258.m_data.deleter.m_device = local_228.m_data.deleter.m_device;
  local_258.m_data.deleter.m_allocator = local_228.m_data.deleter.m_allocator;
  local_258.m_data.object.m_internal = local_228.m_data.object.m_internal;
  local_258.m_data.deleter.m_deviceIface = local_228.m_data.deleter.m_deviceIface;
  local_228.m_data.object.m_internal = 0;
  local_228.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_228.m_data.deleter.m_device = (VkDevice)0x0;
  local_228.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_1f0);
  pLVar4[2] = (Location)local_258.m_data.deleter.m_device;
  pLVar4[3] = (Location)local_258.m_data.deleter.m_allocator;
  pLVar4->m_binding = (undefined4)local_258.m_data.object.m_internal;
  pLVar4->m_arrayElement = local_258.m_data.object.m_internal._4_4_;
  pLVar4[1] = (Location)local_258.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&local_228);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_178);
  (local_1b8->
  super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  ).m_data.ptr = pOVar7;
  return local_1b8;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		return de::MovePtr<Operation>(new Implementation(context, resource));
	}